

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGTextPositioningElement::layoutElement
          (SVGTextPositioningElement *this,SVGLayoutState *state)

{
  DominantBaseline DVar1;
  TextAnchor TVar2;
  WhiteSpace WVar3;
  float fVar4;
  SVGPaintServer SVar5;
  LengthContext lengthContext;
  undefined1 local_28 [16];
  
  SVGLayoutState::font((SVGLayoutState *)local_28);
  FontFace::operator=(&(this->m_font).m_face,(FontFace *)local_28);
  (this->m_font).m_size = (float)local_28._8_4_;
  FontFace::~FontFace((FontFace *)local_28);
  SVar5 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_fill,state->m_fill_opacity);
  this->m_fill = SVar5;
  SVar5 = SVGGraphicsElement::getPaintServer
                    (&this->super_SVGGraphicsElement,&state->m_stroke,state->m_stroke_opacity);
  this->m_stroke = SVar5;
  SVGElement::layoutElement((SVGElement *)this,state);
  local_28._8_4_ = local_28._8_4_ & 0xffffff00;
  local_28._0_8_ = this;
  fVar4 = LengthContext::valueForLength((LengthContext *)local_28,&state->m_stroke_width,Diagonal);
  this->m_stroke_width = fVar4;
  fVar4 = convertBaselineOffset(this,&state->m_baseline_shit);
  this->m_baseline_offset = fVar4;
  DVar1 = state->m_dominant_baseline;
  TVar2 = state->m_text_anchor;
  WVar3 = state->m_white_space;
  this->m_alignment_baseline = state->m_alignment_baseline;
  this->m_dominant_baseline = DVar1;
  this->m_text_anchor = TVar2;
  this->m_white_space = WVar3;
  this->m_direction = state->m_direction;
  return;
}

Assistant:

void SVGTextPositioningElement::layoutElement(const SVGLayoutState& state)
{
    m_font = state.font();
    m_fill = getPaintServer(state.fill(), state.fill_opacity());
    m_stroke = getPaintServer(state.stroke(), state.stroke_opacity());
    SVGGraphicsElement::layoutElement(state);

    LengthContext lengthContext(this);
    m_stroke_width = lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal);
    m_baseline_offset = convertBaselineOffset(state.baseline_shit());
    m_alignment_baseline = state.alignment_baseline();
    m_dominant_baseline = state.dominant_baseline();
    m_text_anchor = state.text_anchor();
    m_white_space = state.white_space();
    m_direction = state.direction();
}